

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# so_layer.cpp
# Opt level: O0

environment_t * __thiscall so_5::layer_t::so_environment(layer_t *this)

{
  exception_t *this_00;
  allocator local_31;
  string local_30 [32];
  layer_t *local_10;
  layer_t *this_local;
  
  if (this->m_env == (environment_t *)0x0) {
    local_10 = this;
    this_00 = (exception_t *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"so_environment isn\'t bound to this layer",&local_31);
    exception_t::exception_t(this_00,(string *)local_30,100);
    __cxa_throw(this_00,&exception_t::typeinfo,exception_t::~exception_t);
  }
  return this->m_env;
}

Assistant:

environment_t &
layer_t::so_environment()
{
	if( nullptr == m_env )
	{
		throw so_5::exception_t(
			"so_environment isn't bound to this layer",
			rc_layer_not_binded_to_so_env );
	}

	return *m_env;
}